

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageFactory *pMVar1;
  bool bVar2;
  Type TVar3;
  CppType CVar4;
  int iVar5;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  TcParseTableBase *pTVar7;
  LogMessage *pLVar8;
  EnumDescriptor *pEVar9;
  string_view v;
  LogMessage local_48;
  Voidify local_31;
  Descriptor *local_30;
  FieldDescriptor *extension;
  ExtensionInfo *output_local;
  DescriptorPoolExtensionFinder *pDStack_18;
  int number_local;
  DescriptorPoolExtensionFinder *this_local;
  
  extension = (FieldDescriptor *)output;
  output_local._4_4_ = number;
  pDStack_18 = this;
  local_30 = (Descriptor *)
             DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (local_30 == (Descriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)local_30);
    *(char *)((long)&(extension->all_names_).payload_ + 4) = (char)TVar3;
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)local_30);
    *(bool *)((long)&(extension->all_names_).payload_ + 5) = bVar2;
    bVar2 = FieldDescriptor::is_packed((FieldDescriptor *)local_30);
    *(bool *)((long)&(extension->all_names_).payload_ + 6) = bVar2;
    extension->containing_type_ = local_30;
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)local_30);
    if (CVar4 == CPPTYPE_MESSAGE) {
      pMVar1 = this->factory_;
      pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)local_30);
      iVar5 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar6);
      extension->file_ = (FileDescriptor *)CONCAT44(extraout_var,iVar5);
      pTVar7 = protobuf::MessageLite::GetTcParseTable((MessageLite *)extension->file_);
      extension->type_once_ = (once_flag *)pTVar7;
      if (extension->file_ == (FileDescriptor *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x11d,"output->message_info.prototype != nullptr");
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar8,(char (*) [65])
                                   "Extension factory\'s GetPrototype() returned nullptr; extension: "
                           );
        v = FieldDescriptor::full_name((FieldDescriptor *)local_30);
        pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,v);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar8);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_48);
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)local_30);
      if (CVar4 == CPPTYPE_ENUM) {
        extension->file_ = (FileDescriptor *)ValidateEnumUsingDescriptor;
        pEVar9 = FieldDescriptor::enum_type((FieldDescriptor *)local_30);
        extension->type_once_ = (once_flag *)pEVar9;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == nullptr) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->is_packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_info.prototype =
          factory_->GetPrototype(extension->message_type());
      output->message_info.tc_table =
          output->message_info.prototype->GetTcParseTable();
      ABSL_CHECK(output->message_info.prototype != nullptr)
          << "Extension factory's GetPrototype() returned nullptr; extension: "
          << extension->full_name();

    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}